

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O2

Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> * __thiscall
KDIS::UTILS::Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
          (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *__return_storage_ptr__,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *Value)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  KUINT16 i;
  long lVar5;
  float (*pafVar6) [3];
  float (*pafVar7) [3];
  KUINT16 j;
  long lVar8;
  float (*pafVar9) [3];
  KUINT16 k;
  long lVar10;
  float fVar11;
  
  __return_storage_ptr__->Data[2][2] = this->Data[2][2];
  fVar11 = this->Data[0][0];
  fVar1 = this->Data[0][1];
  fVar2 = this->Data[0][2];
  fVar3 = this->Data[1][0];
  uVar4 = *(undefined8 *)this->Data[2];
  *(undefined8 *)(__return_storage_ptr__->Data[1] + 1) = *(undefined8 *)(this->Data[1] + 1);
  *(undefined8 *)__return_storage_ptr__->Data[2] = uVar4;
  __return_storage_ptr__->Data[0][0] = fVar11;
  __return_storage_ptr__->Data[0][1] = fVar1;
  __return_storage_ptr__->Data[0][2] = fVar2;
  __return_storage_ptr__->Data[1][0] = fVar3;
  pafVar6 = (float (*) [3])__return_storage_ptr__;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    pafVar7 = (float (*) [3])Value;
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      fVar11 = 0.0;
      pafVar9 = pafVar7;
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        fVar11 = fVar11 + (*(float (*) [3])*pafVar6)[lVar10] * (*(float (*) [3])*pafVar9)[0];
        pafVar9 = pafVar9 + 1;
      }
      __return_storage_ptr__->Data[lVar5][lVar8] = fVar11;
      pafVar7 = (float (*) [3])(*pafVar7 + 1);
    }
    pafVar6 = pafVar6 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix operator * ( const Matrix & Value )
    {
        Matrix m = *this;
        Type tmp = 0,
             tmp2 = 0,
             sum = 0;

        for( KUINT16 i = 0; i < rows; ++i )
        {
            for( KUINT16 j = 0; j < cols; ++j )
            {
                for( KUINT16 k = 0; k < cols; ++k )
                {
                    tmp += m.Data[i][k] * Value.Data[k][j];
                }

                m.Data[i][j] = tmp;
                tmp = 0;
            }
        }

        return m;
    }